

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store_parm(XMLWriter *this,char *name,shared_ptr<embree::Texture> *tex)

{
  void *pvVar1;
  ulong uVar2;
  bool bVar3;
  element_type *peVar4;
  mapped_type_conflict1 *pmVar5;
  ostream *poVar6;
  streamoff sVar7;
  char *pcVar8;
  char *in_RSI;
  long in_RDI;
  size_t id_1;
  size_t id;
  streampos offset;
  map<std::shared_ptr<embree::Texture>,_unsigned_long,_std::less<std::shared_ptr<embree::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff38;
  XMLWriter *in_stack_ffffffffffffff40;
  XMLWriter *this_00;
  undefined8 in_stack_ffffffffffffff48;
  Format format;
  key_type *in_stack_ffffffffffffff78;
  map<std::shared_ptr<embree::Texture>,_unsigned_long,_std::less<std::shared_ptr<embree::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff80;
  fpos local_38 [16];
  _Self local_28;
  _Self local_20 [2];
  char *local_10;
  
  format = (Format)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_10 = in_RSI;
  bVar3 = std::operator==((shared_ptr<embree::Texture> *)in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
  if (!bVar3) {
    local_20[0]._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<embree::Texture>,_unsigned_long,_std::less<std::shared_ptr<embree::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>_>_>
         ::find(in_stack_ffffffffffffff38,(key_type *)0x3e0fd8);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<embree::Texture>,_unsigned_long,_std::less<std::shared_ptr<embree::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>_>_>
         ::end(in_stack_ffffffffffffff38);
    bVar3 = std::operator!=(local_20,&local_28);
    if (bVar3) {
      tab(in_stack_ffffffffffffff40);
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x10),"<texture3d name=\"");
      poVar6 = std::operator<<(poVar6,local_10);
      poVar6 = std::operator<<(poVar6,"\" id=\"");
      pmVar5 = std::
               map<std::shared_ptr<embree::Texture>,_unsigned_long,_std::less<std::shared_ptr<embree::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>_>_>
               ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pmVar5);
      poVar6 = std::operator<<(poVar6,"\"/>");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else if ((*(byte *)(in_RDI + 0x490) & 1) == 0) {
      this_00 = *(XMLWriter **)(in_RDI + 0x428);
      *(undefined1 **)(in_RDI + 0x428) = &this_00->field_0x1;
      pmVar5 = std::
               map<std::shared_ptr<embree::Texture>,_unsigned_long,_std::less<std::shared_ptr<embree::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>_>_>
               ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      *pmVar5 = (mapped_type_conflict1)this_00;
      tab(this_00);
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x10),"<texture3d name=\"");
      poVar6 = std::operator<<(poVar6,local_10);
      poVar6 = std::operator<<(poVar6,"\" id=\"");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)this_00);
      poVar6 = std::operator<<(poVar6,"\" src=\"");
      peVar4 = std::__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3e1361);
      poVar6 = std::operator<<(poVar6,(string *)&peVar4->fileName);
      poVar6 = std::operator<<(poVar6,"\"/>");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      local_38 = (fpos  [16])std::istream::tellg();
      peVar4 = std::__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3e10f4);
      pvVar1 = peVar4->data;
      std::__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x3e1107);
      std::__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x3e1117);
      std::__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x3e1130);
      std::ostream::write((char *)(in_RDI + 0x220),(long)pvVar1);
      uVar2 = *(ulong *)(in_RDI + 0x428);
      *(ulong *)(in_RDI + 0x428) = uVar2 + 1;
      pmVar5 = std::
               map<std::shared_ptr<embree::Texture>,_unsigned_long,_std::less<std::shared_ptr<embree::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>_>_>
               ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      *pmVar5 = uVar2;
      tab(in_stack_ffffffffffffff40);
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x10),"<texture3d name=\"");
      poVar6 = std::operator<<(poVar6,local_10);
      poVar6 = std::operator<<(poVar6,"\" id=\"");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2);
      poVar6 = std::operator<<(poVar6,"\" ofs=\"");
      sVar7 = std::fpos::operator_cast_to_long(local_38);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
      poVar6 = std::operator<<(poVar6,"\" width=\"");
      peVar4 = std::__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3e1228);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,peVar4->width);
      poVar6 = std::operator<<(poVar6,"\" height=\"");
      peVar4 = std::__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3e1252);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,peVar4->height);
      poVar6 = std::operator<<(poVar6,"\" format=\"");
      std::__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x3e127d);
      pcVar8 = Texture::format_to_string(format);
      poVar6 = std::operator<<(poVar6,pcVar8);
      poVar6 = std::operator<<(poVar6,"\"/>");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void XMLWriter::store_parm(const char* name, const std::shared_ptr<Texture> tex) 
  {
    if (tex == nullptr) return;

    if (textureMap.find(tex) != textureMap.end()) {
      tab(); xml << "<texture3d name=\"" << name << "\" id=\"" << textureMap[tex] << "\"/>" << std::endl;
    } else if (embedTextures) {
      std::streampos offset = bin.tellg();
      bin.write((char*)tex->data,tex->width*tex->height*tex->bytesPerTexel);
      const size_t id = textureMap[tex] = currentNodeID++;
      tab(); xml << "<texture3d name=\"" << name << "\" id=\"" << id << "\" ofs=\"" << offset 
                 << "\" width=\"" << tex->width << "\" height=\"" << tex->height 
                 << "\" format=\"" << Texture::format_to_string(tex->format) << "\"/>" << std::endl;
    }
    else {
      const size_t id = textureMap[tex] = currentNodeID++;
      tab(); xml << "<texture3d name=\"" << name << "\" id=\"" << id << "\" src=\"" << tex->fileName << "\"/>" << std::endl;
    }
  }